

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcTrimmedCurve::IfcTrimmedCurve(IfcTrimmedCurve *this)

{
  IfcTrimmedCurve *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xc8,"IfcTrimmedCurve");
  IfcBoundedCurve::IfcBoundedCurve
            (&this->super_IfcBoundedCurve,&PTR_construction_vtable_24__00f1b8f0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTrimmedCurve,_5UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcTrimmedCurve,_5UL> *)
             &(this->super_IfcBoundedCurve).super_IfcCurve.field_0x40,
             &PTR_construction_vtable_24__00f1b9a0);
  (this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf1b810;
  *(undefined8 *)&this->field_0xc8 = 0xf1b8d8;
  *(undefined8 *)
   &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf1b838;
  *(undefined8 *)
   &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf1b860;
  *(undefined8 *)
   &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.field_0x30 =
       0xf1b888;
  *(undefined8 *)&(this->super_IfcBoundedCurve).super_IfcCurve.field_0x40 = 0xf1b8b0;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcCurve> *)&(this->super_IfcBoundedCurve).field_0x50,
             (LazyObject *)0x0);
  STEP::ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_2UL>::ListOf(&this->Trim1);
  STEP::ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_2UL>::ListOf(&this->Trim2);
  std::__cxx11::string::string((string *)&this->SenseAgreement);
  std::__cxx11::string::string((string *)&this->MasterRepresentation);
  return;
}

Assistant:

IfcTrimmedCurve() : Object("IfcTrimmedCurve") {}